

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O1

uchar duckdb::AddOperatorOverflowCheck::Operation<unsigned_char,unsigned_char,unsigned_char>
                (uchar left,uchar right)

{
  uint uVar1;
  OutOfRangeException *this;
  PhysicalType type;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  uVar1 = (int)CONCAT71(in_register_00000031,right) + (int)CONCAT71(in_register_00000039,left);
  if (uVar1 < 0x100) {
    return (uchar)uVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Overflow in addition of %s (%s + %s)!","");
  TypeIdToString_abi_cxx11_(&local_48,(duckdb *)0x2,type);
  NumericHelper::ToString<unsigned_char>(&local_68,left);
  NumericHelper::ToString<unsigned_char>(&local_88,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_a8,&local_48,&local_68,&local_88);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryAddOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of %s (%s + %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}